

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synced_bcf_reader.c
# Opt level: O0

char * bcf_sr_strerror(int errnum)

{
  int *piVar1;
  char *pcStack_10;
  int errnum_local;
  
  switch(errnum) {
  case 0:
    piVar1 = __errno_location();
    pcStack_10 = strerror(*piVar1);
    break;
  case 1:
    pcStack_10 = "not compressed with bgzip";
    break;
  case 2:
    pcStack_10 = "could not load index";
    break;
  case 3:
    pcStack_10 = "unknown file type";
    break;
  case 4:
    pcStack_10 = "API usage error";
    break;
  case 5:
    pcStack_10 = "could not parse header";
    break;
  default:
    pcStack_10 = "";
  }
  return pcStack_10;
}

Assistant:

char *bcf_sr_strerror(int errnum)
{
    switch (errnum)
    {
        case open_failed: 
            return strerror(errno); break;
        case not_bgzf:
            return "not compressed with bgzip"; break;
        case idx_load_failed:
            return "could not load index"; break;
        case file_type_error:
            return "unknown file type"; break;
        case api_usage_error:
            return "API usage error"; break;
        case header_error:
            return "could not parse header"; break;
        default: return ""; 
    }
}